

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sinc_resampler.cc
# Opt level: O1

void __thiscall
webrtc::SincResampler::SincResampler
          (SincResampler *this,double io_sample_rate_ratio,size_t request_frames,
          SincResamplerCallback *read_cb)

{
  float *pfVar1;
  
  this->_vptr_SincResampler = (_func_int **)&PTR__SincResampler_001cfc80;
  this->io_sample_rate_ratio_ = io_sample_rate_ratio;
  this->read_cb_ = read_cb;
  this->request_frames_ = request_frames;
  this->input_buffer_size_ = request_frames + 0x20;
  pfVar1 = (float *)AlignedMalloc(0x1080,0x10);
  (this->kernel_storage_)._M_t.super___uniq_ptr_impl<float,_webrtc::AlignedFreeDeleter>._M_t.
  super__Tuple_impl<0UL,_float_*,_webrtc::AlignedFreeDeleter>.super__Head_base<0UL,_float_*,_false>.
  _M_head_impl = pfVar1;
  pfVar1 = (float *)AlignedMalloc(0x1080,0x10);
  (this->kernel_pre_sinc_storage_)._M_t.super___uniq_ptr_impl<float,_webrtc::AlignedFreeDeleter>.
  _M_t.super__Tuple_impl<0UL,_float_*,_webrtc::AlignedFreeDeleter>.
  super__Head_base<0UL,_float_*,_false>._M_head_impl = pfVar1;
  pfVar1 = (float *)AlignedMalloc(0x1080,0x10);
  (this->kernel_window_storage_)._M_t.super___uniq_ptr_impl<float,_webrtc::AlignedFreeDeleter>._M_t.
  super__Tuple_impl<0UL,_float_*,_webrtc::AlignedFreeDeleter>.super__Head_base<0UL,_float_*,_false>.
  _M_head_impl = pfVar1;
  pfVar1 = (float *)AlignedMalloc(this->input_buffer_size_ << 2,0x10);
  (this->input_buffer_)._M_t.super___uniq_ptr_impl<float,_webrtc::AlignedFreeDeleter>._M_t.
  super__Tuple_impl<0UL,_float_*,_webrtc::AlignedFreeDeleter>.super__Head_base<0UL,_float_*,_false>.
  _M_head_impl = pfVar1;
  this->r1_ = pfVar1;
  this->r2_ = pfVar1 + 0x10;
  if (this->request_frames_ == 0) {
    __assert_fail("request_frames_ > 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/ctwgL[P]webrtc-beamforming/webrtc/webrtc/common_audio/resampler/sinc_resampler.cc"
                  ,0xb0,
                  "webrtc::SincResampler::SincResampler(double, size_t, SincResamplerCallback *)");
  }
  this->virtual_source_idx_ = 0.0;
  this->buffer_primed_ = false;
  memset(pfVar1,0,this->input_buffer_size_ << 2);
  UpdateRegions(this,false);
  if (0x20 < this->block_size_) {
    memset((this->kernel_storage_)._M_t.super___uniq_ptr_impl<float,_webrtc::AlignedFreeDeleter>.
           _M_t.super__Tuple_impl<0UL,_float_*,_webrtc::AlignedFreeDeleter>.
           super__Head_base<0UL,_float_*,_false>._M_head_impl,0,0x1080);
    memset((this->kernel_pre_sinc_storage_)._M_t.
           super___uniq_ptr_impl<float,_webrtc::AlignedFreeDeleter>._M_t.
           super__Tuple_impl<0UL,_float_*,_webrtc::AlignedFreeDeleter>.
           super__Head_base<0UL,_float_*,_false>._M_head_impl,0,0x1080);
    memset((this->kernel_window_storage_)._M_t.
           super___uniq_ptr_impl<float,_webrtc::AlignedFreeDeleter>._M_t.
           super__Tuple_impl<0UL,_float_*,_webrtc::AlignedFreeDeleter>.
           super__Head_base<0UL,_float_*,_false>._M_head_impl,0,0x1080);
    InitializeKernel(this);
    return;
  }
  __assert_fail("block_size_ > kKernelSize",
                "/workspace/llm4binary/github/license_c_cmakelists/ctwgL[P]webrtc-beamforming/webrtc/webrtc/common_audio/resampler/sinc_resampler.cc"
                ,0xb2,
                "webrtc::SincResampler::SincResampler(double, size_t, SincResamplerCallback *)");
}

Assistant:

SincResampler::SincResampler(double io_sample_rate_ratio,
                             size_t request_frames,
                             SincResamplerCallback* read_cb)
    : io_sample_rate_ratio_(io_sample_rate_ratio),
      read_cb_(read_cb),
      request_frames_(request_frames),
      input_buffer_size_(request_frames_ + kKernelSize),
      // Create input buffers with a 16-byte alignment for SSE optimizations.
      kernel_storage_(static_cast<float*>(
          AlignedMalloc(sizeof(float) * kKernelStorageSize, 16))),
      kernel_pre_sinc_storage_(static_cast<float*>(
          AlignedMalloc(sizeof(float) * kKernelStorageSize, 16))),
      kernel_window_storage_(static_cast<float*>(
          AlignedMalloc(sizeof(float) * kKernelStorageSize, 16))),
      input_buffer_(static_cast<float*>(
          AlignedMalloc(sizeof(float) * input_buffer_size_, 16))),
#if defined(WEBRTC_CPU_DETECTION)
      convolve_proc_(NULL),
#endif
      r1_(input_buffer_.get()),
      r2_(input_buffer_.get() + kKernelSize / 2) {
#if defined(WEBRTC_CPU_DETECTION)
  InitializeCPUSpecificFeatures();
  assert(convolve_proc_);
#endif
  assert(request_frames_ > 0);
  Flush();
  assert(block_size_ > kKernelSize);

  memset(kernel_storage_.get(), 0,
         sizeof(*kernel_storage_.get()) * kKernelStorageSize);
  memset(kernel_pre_sinc_storage_.get(), 0,
         sizeof(*kernel_pre_sinc_storage_.get()) * kKernelStorageSize);
  memset(kernel_window_storage_.get(), 0,
         sizeof(*kernel_window_storage_.get()) * kKernelStorageSize);

  InitializeKernel();
}